

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NgammaT.cpp
# Opt level: O2

void __thiscall OpenMD::NgammaT::evolveEtaA(NgammaT *this)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Mat3x3d hmat;
  Mat3x3d local_50;
  
  Snapshot::getHmat(&local_50,(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap
                   );
  uVar2 = this->axis_;
  uVar4 = (ulong)this->axis1_;
  uVar3 = (ulong)this->axis2_;
  dVar7 = -*(double *)
            ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
            (ulong)uVar2 * 0x20);
  dVar8 = (this->super_NPT).targetPressure / 163882576.0;
  dVar1 = *(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + uVar3 * 0x20);
  dVar5 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           uVar4 * 0x20) *
          *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           uVar3 * 0x20) * (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
  dVar6 = (this->super_NPT).NkBT * (this->super_NPT).tb2;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar4 * 0x20) =
       *(double *)
        ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
        uVar4 * 0x20) -
       (((*(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + uVar4 * 0x20) - dVar8) * dVar7 -
        this->surfaceTension_) * dVar5) / dVar6;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar3 * 0x20) =
       *(double *)
        ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
        uVar3 * 0x20) - (((dVar1 - dVar8) * dVar7 - this->surfaceTension_) * dVar5) / dVar6;
  *(undefined8 *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   (ulong)uVar2 * 0x20) = 0;
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&this->oldEta_,(RectMatrix<double,_3U,_3U> *)&this->eta);
  return;
}

Assistant:

void NgammaT::evolveEtaA() {
    Mat3x3d hmat = snap->getHmat();
    RealType hz  = hmat(axis_, axis_);
    RealType Axy = hmat(axis1_, axis1_) * hmat(axis2_, axis2_);
    RealType sx  = -hz * (press(axis1_, axis1_) -
                         targetPressure / Constants::pressureConvert);
    RealType sy  = -hz * (press(axis2_, axis2_) -
                         targetPressure / Constants::pressureConvert);
    eta(axis1_, axis1_) -= dt2 * Axy * (sx - surfaceTension_) / (NkBT * tb2);
    eta(axis2_, axis2_) -= dt2 * Axy * (sy - surfaceTension_) / (NkBT * tb2);
    eta(axis_, axis_) = 0.0;
    oldEta_           = eta;
  }